

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::Texture2DArrayFilteringCase::init
          (Texture2DArrayFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  *this_00;
  uint height;
  pointer pPVar1;
  uint uVar2;
  uint uVar3;
  int i;
  int iVar4;
  int extraout_EAX;
  long lVar5;
  Texture2DArray *pTVar6;
  RenderTarget *pRVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  Vec4 gMax;
  Vector<float,_4> res_7;
  PixelBufferAccess levelBuf;
  Vec4 gMin;
  Vec4 cScale;
  Vec4 cBias;
  Vector<float,_4> res_1;
  Vector<float,_4> res_6;
  IVec4 levelSwz [4];
  TextureFormat texFmt;
  RGBA local_80 [4];
  TextureFormatInfo fmtInfo;
  
  texFmt = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  cScale.m_data[0] = 0.0;
  cScale.m_data[1] = 0.0;
  cScale.m_data[2] = 0.0;
  cScale.m_data[3] = 0.0;
  lVar5 = 0;
  do {
    cScale.m_data[lVar5] = fmtInfo.valueMax.m_data[lVar5] - fmtInfo.valueMin.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  cBias.m_data[0] = fmtInfo.valueMin.m_data[0];
  cBias.m_data[1] = fmtInfo.valueMin.m_data[1];
  cBias.m_data[2] = fmtInfo.valueMin.m_data[2];
  cBias.m_data[3] = fmtInfo.valueMin.m_data[3];
  uVar11 = this->m_width;
  height = this->m_height;
  uVar3 = height;
  if ((int)height < (int)uVar11) {
    uVar3 = uVar11;
  }
  uVar2 = 0x20;
  if (uVar3 != 0) {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  pTVar6 = (Texture2DArray *)operator_new(0x70);
  glu::Texture2DArray::Texture2DArray
            (pTVar6,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,uVar11,
             height,this->m_numLayers);
  this->m_gradientTex = pTVar6;
  pTVar6 = (Texture2DArray *)operator_new(0x70);
  glu::Texture2DArray::Texture2DArray
            (pTVar6,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,
             this->m_width,this->m_height,this->m_numLayers);
  this->m_gridTex = pTVar6;
  levelSwz[0].m_data[0] = 0;
  levelSwz[0].m_data[1] = 1;
  levelSwz[0].m_data[2] = 2;
  levelSwz[0].m_data[3] = 3;
  levelSwz[1].m_data[0] = 2;
  levelSwz[1].m_data[1] = 1;
  levelSwz[1].m_data[2] = 3;
  levelSwz[1].m_data[3] = 0;
  levelSwz[2].m_data[0] = 3;
  levelSwz[2].m_data[1] = 0;
  levelSwz[2].m_data[2] = 1;
  levelSwz[2].m_data[3] = 2;
  levelSwz[3].m_data[0] = 1;
  levelSwz[3].m_data[1] = 3;
  levelSwz[3].m_data[2] = 2;
  levelSwz[3].m_data[3] = 0;
  if (uVar3 != 0) {
    iVar4 = 0x1f - uVar2;
    lVar5 = 0;
    iVar16 = 0;
    if (0 < iVar4) {
      iVar16 = iVar4;
    }
    uVar15 = 0;
    do {
      tcu::Texture2DArray::allocLevel(&this->m_gradientTex->m_refTexture,(int)uVar15);
      pPVar1 = (this->m_gradientTex->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      levelBuf.super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar1 + uVar15);
      lVar9 = 2;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] =
             *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar9 * 4 + lVar5 + -8);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 5);
      lVar9 = 5;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] =
             *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar9 * 4 + lVar5 + -8);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      levelBuf.super_ConstPixelBufferAccess.m_data = (void *)((TextureFormat *)(pPVar1 + uVar15))[4]
      ;
      if (0 < this->m_numLayers) {
        uVar11 = 0;
        do {
          uVar12 = (ulong)((uVar11 & 3) << 4);
          lVar9 = (long)*(int *)((long)levelSwz[0].m_data + uVar12 + 0xc);
          lVar8 = (long)*(int *)((long)levelSwz[0].m_data + uVar12 + 8);
          lVar10 = (long)*(int *)((long)levelSwz[0].m_data + uVar12 + 4);
          lVar13 = (long)*(int *)((long)levelSwz[0].m_data + uVar12);
          local_1b8 = 0;
          uStack_1b0 = 0x3f80000000000000;
          gMax.m_data[1] = *(float *)((long)&local_1b8 + lVar10 * 4);
          gMax.m_data[0] = *(float *)((long)&local_1b8 + lVar13 * 4);
          gMax.m_data[3] = *(float *)((long)&local_1b8 + lVar9 * 4);
          gMax.m_data[2] = *(float *)((long)&local_1b8 + lVar8 * 4);
          res_1.m_data[0] = 0.0;
          res_1.m_data[1] = 0.0;
          res_1.m_data[2] = 0.0;
          res_1.m_data[3] = 0.0;
          lVar14 = 0;
          do {
            res_1.m_data[lVar14] = gMax.m_data[lVar14] * cScale.m_data[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          gMin.m_data[0] = 0.0;
          gMin.m_data[1] = 0.0;
          gMin.m_data[2] = 0.0;
          gMin.m_data[3] = 0.0;
          lVar14 = 0;
          do {
            gMin.m_data[lVar14] = res_1.m_data[lVar14] + cBias.m_data[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          res_7.m_data._0_8_ = &DAT_3f8000003f800000;
          res_7.m_data[2] = 1.0;
          res_7.m_data[3] = 0.0;
          local_1b8 = CONCAT44(res_7.m_data[lVar10],res_7.m_data[lVar13]);
          uStack_1b0 = CONCAT44(res_7.m_data[lVar9],res_7.m_data[lVar8]);
          res_1.m_data[0] = 0.0;
          res_1.m_data[1] = 0.0;
          res_1.m_data[2] = 0.0;
          res_1.m_data[3] = 0.0;
          lVar9 = 0;
          do {
            res_1.m_data[lVar9] = *(float *)((long)&local_1b8 + lVar9 * 4) * cScale.m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          gMax.m_data[0] = 0.0;
          gMax.m_data[1] = 0.0;
          gMax.m_data[2] = 0.0;
          gMax.m_data[3] = 0.0;
          lVar9 = 0;
          do {
            gMax.m_data[lVar9] = res_1.m_data[lVar9] + cBias.m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          tcu::getSubregion((PixelBufferAccess *)&res_1,&levelBuf,0,0,uVar11,
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
          tcu::fillWithComponentGradients((PixelBufferAccess *)&res_1,&gMin,&gMax);
          uVar11 = uVar11 + 1;
        } while ((int)uVar11 < this->m_numLayers);
      }
      uVar15 = uVar15 + 1;
      lVar5 = lVar5 + 0x28;
    } while (uVar15 != iVar16 + 1);
    lVar5 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    uVar15 = 0;
    do {
      tcu::Texture2DArray::allocLevel(&this->m_gridTex->m_refTexture,(int)uVar15);
      pPVar1 = (this->m_gridTex->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      levelBuf.super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar1 + uVar15);
      lVar9 = 2;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] =
             *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar9 * 4 + lVar5 + -8);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 5);
      lVar9 = 5;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] =
             *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar9 * 4 + lVar5 + -8);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      levelBuf.super_ConstPixelBufferAccess.m_data =
           *(void **)((TextureFormat *)(pPVar1 + uVar15) + 4);
      if (0 < this->m_numLayers) {
        iVar16 = 0;
        do {
          tcu::getSubregion((PixelBufferAccess *)&res_1,&levelBuf,0,0,iVar16,
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
          tcu::RGBA::toVec((RGBA *)&local_1b8);
          gMax.m_data[0] = 0.0;
          gMax.m_data[1] = 0.0;
          gMax.m_data[2] = 0.0;
          gMax.m_data[3] = 0.0;
          lVar9 = 0;
          do {
            gMax.m_data[lVar9] = *(float *)((long)&local_1b8 + lVar9 * 4) * cScale.m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          gMin.m_data[0] = 0.0;
          gMin.m_data[1] = 0.0;
          gMin.m_data[2] = 0.0;
          gMin.m_data[3] = 0.0;
          lVar9 = 0;
          do {
            gMin.m_data[lVar9] = gMax.m_data[lVar9] + cBias.m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          tcu::RGBA::toVec(local_80);
          res_6.m_data[0] = 0.0;
          res_6.m_data[1] = 0.0;
          res_6.m_data[2] = 0.0;
          res_6.m_data[3] = 0.0;
          lVar9 = 0;
          do {
            res_6.m_data[lVar9] = (float)local_80[lVar9].m_value * cScale.m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          res_7.m_data[0] = 0.0;
          res_7.m_data[1] = 0.0;
          res_7.m_data[2] = 0.0;
          res_7.m_data[3] = 0.0;
          lVar9 = 0;
          do {
            res_7.m_data[lVar9] = res_6.m_data[lVar9] + cBias.m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          tcu::fillWithGrid((PixelBufferAccess *)&res_1,4,&gMin,&res_7);
          iVar16 = iVar16 + 1;
        } while (iVar16 < this->m_numLayers);
      }
      uVar15 = uVar15 + 1;
      lVar5 = lVar5 + 0x28;
    } while (uVar15 != iVar4 + 1);
  }
  glu::Texture2DArray::upload(this->m_gradientTex);
  glu::Texture2DArray::upload(this->m_gridTex);
  levelBuf.super_ConstPixelBufferAccess.m_format = (TextureFormat)this->m_gradientTex;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3fc00000;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x40333333;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x40800000;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = -0x3fd33333;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)((float)this->m_numLayers + 0.5);
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
  this_00 = &this->m_cases;
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
            (this_00,(FilterCase *)&levelBuf);
  levelBuf.super_ConstPixelBufferAccess.m_format = (TextureFormat)this->m_gridTex;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3e4ccccd;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3e333333;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x40000000;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = -0x3f933333;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)((float)this->m_numLayers + 0.5);
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
            (this_00,(FilterCase *)&levelBuf);
  levelBuf.super_ConstPixelBufferAccess.m_format = (TextureFormat)this->m_gridTex;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40b33333;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x3feccccd;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3e4ccccd;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = -0x42333333;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = -0x41000000;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)((float)this->m_numLayers + 0.5);
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
            (this_00,(FilterCase *)&levelBuf);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar7->m_numSamples == 0) {
    levelBuf.super_ConstPixelBufferAccess.m_format = (TextureFormat)this->m_gradientTex;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40000000;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40400000;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x42333333;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f666666;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0x3fc00054;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0x3fbfffac;
    std::
    vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
              (this_00,(FilterCase *)&levelBuf);
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DArrayFilteringCase::init (void)
{
	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(de::max(m_width, m_height)) + 1;

		// Create textures.
		m_gradientTex	= new glu::Texture2DArray(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_numLayers);
		m_gridTex		= new glu::Texture2DArray(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_numLayers);

		const tcu::IVec4 levelSwz[] =
		{
			tcu::IVec4(0,1,2,3),
			tcu::IVec4(2,1,3,0),
			tcu::IVec4(3,0,1,2),
			tcu::IVec4(1,3,2,0),
		};

		// Fill first gradient texture (gradient direction varies between layers).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gradientTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gradientTex->getRefTexture().getLevel(levelNdx);

			for (int layerNdx = 0; layerNdx < m_numLayers; layerNdx++)
			{
				const tcu::IVec4	swz		= levelSwz[layerNdx%DE_LENGTH_OF_ARRAY(levelSwz)];
				const tcu::Vec4		gMin	= tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;
				const tcu::Vec4		gMax	= tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;

				tcu::fillWithComponentGradients(tcu::getSubregion(levelBuf, 0, 0, layerNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1), gMin, gMax);
			}
		}

		// Fill second with grid texture (each layer has unique colors).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gridTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gridTex->getRefTexture().getLevel(levelNdx);

			for (int layerNdx = 0; layerNdx < m_numLayers; layerNdx++)
			{
				const deUint32	step	= 0x00ffffff / (numLevels*m_numLayers - 1);
				const deUint32	rgb		= step * (levelNdx + layerNdx*numLevels);
				const deUint32	colorA	= 0xff000000 | rgb;
				const deUint32	colorB	= 0xff000000 | ~rgb;

				tcu::fillWithGrid(tcu::getSubregion(levelBuf, 0, 0, layerNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1),
								  4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec2( 1.5f,  2.8f  ),	tcu::Vec2(-1.0f, -2.7f), tcu::Vec2(-0.5f, float(m_numLayers)+0.5f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec2( 0.2f,  0.175f),	tcu::Vec2(-2.0f, -3.7f), tcu::Vec2(-0.5f, float(m_numLayers)+0.5f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec2(-0.8f, -2.3f  ),	tcu::Vec2( 0.2f, -0.1f), tcu::Vec2(float(m_numLayers)+0.5f, -0.5f)));

		// Level rounding - only in single-sample configs as multisample configs may produce smooth transition at the middle.
		if (m_context.getRenderTarget().getNumSamples() == 0)
			m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec2(-2.0f, -1.5f  ),	tcu::Vec2(-0.1f,  0.9f), tcu::Vec2(1.50001f, 1.49999f)));

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DArrayFilteringCase::deinit();
		throw;
	}
}